

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O0

bool cppurses::System::send_event(Event *event)

{
  bool bVar1;
  int iVar2;
  bool local_19;
  bool handled;
  Event *event_local;
  
  bVar1 = detail::is_sendable(event);
  if (bVar1) {
    local_19 = Event::send_to_all_filters(event);
    if (!local_19) {
      iVar2 = (*event->_vptr_Event[2])();
      local_19 = (bool)((byte)iVar2 & 1);
    }
    event_local._7_1_ = local_19;
  }
  else {
    event_local._7_1_ = false;
  }
  return event_local._7_1_;
}

Assistant:

static auto send_event(const Event& event) -> bool
    {
        if (!detail::is_sendable(event))
            return false;
        bool handled = event.send_to_all_filters();
        if (!handled)
            handled = event.send();
        return handled;
    }